

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O0

void __thiscall
icu_63::UCharsTrieBuilder::UCTLinearMatchNode::UCTLinearMatchNode
          (UCTLinearMatchNode *this,UChar *units,int32_t len,Node *nextNode)

{
  int iVar1;
  int32_t iVar2;
  Node *nextNode_local;
  int32_t len_local;
  UChar *units_local;
  UCTLinearMatchNode *this_local;
  
  StringTrieBuilder::LinearMatchNode::LinearMatchNode(&this->super_LinearMatchNode,len,nextNode);
  (this->super_LinearMatchNode).super_ValueNode.super_Node.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UCTLinearMatchNode_004b17b0;
  this->s = units;
  iVar1 = (this->super_LinearMatchNode).super_ValueNode.super_Node.hash;
  iVar2 = ustr_hashUCharsN_63(units,len);
  (this->super_LinearMatchNode).super_ValueNode.super_Node.hash = iVar1 * 0x25 + iVar2;
  return;
}

Assistant:

UCharsTrieBuilder::UCTLinearMatchNode::UCTLinearMatchNode(const UChar *units, int32_t len, Node *nextNode)
        : LinearMatchNode(len, nextNode), s(units) {
    hash=hash*37u+ustr_hashUCharsN(units, len);
}